

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O2

void vault_objects(chunk_conflict *c,loc_conflict grid,wchar_t depth,wchar_t num)

{
  loc_conflict grid_00;
  _Bool _Var1;
  uint32_t uVar2;
  int iVar3;
  bool bVar4;
  loc_conflict near;
  
  do {
    if (num < L'\x01') {
      return;
    }
    iVar3 = 0xb;
    do {
      bVar4 = iVar3 == 0;
      iVar3 = iVar3 + -1;
      if (bVar4) goto LAB_001531a3;
      _Var1 = find_nearby_grid(c,&near,grid,L'\x02',L'\x03');
      grid_00 = near;
      if (!_Var1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-util.c"
                      ,0x340,"void vault_objects(struct chunk *, struct loc, int, int)");
      }
      _Var1 = square_canputitem(c,(loc)near);
    } while (!_Var1);
    uVar2 = Rand_div(100);
    if ((int)uVar2 < 0x4b) {
      place_object(c,grid_00,depth,false,false,'\x03',L'\0');
    }
    else {
      place_gold(c,grid_00,depth,'\x05');
    }
LAB_001531a3:
    num = num + L'\xffffffff';
  } while( true );
}

Assistant:

void vault_objects(struct chunk *c, struct loc grid, int depth, int num)
{
	int i;

	/* Attempt to place 'num' objects */
	for (; num > 0; --num) {
		/* Try up to 11 spots looking for empty space */
		for (i = 0; i < 11; ++i) {
			struct loc near;

			/* Pick a random location */
			if (!find_nearby_grid(c, &near, grid, 2, 3)) assert(0);

			/* Require "clean" floor space */
			if (!square_canputitem(c, near)) continue;

			/* Place an item or gold */
			if (randint0(100) < 75)
				place_object(c, near, depth, false, false, ORIGIN_SPECIAL, 0);
			else
				place_gold(c, near, depth, ORIGIN_VAULT);

			/* Placement accomplished */
			break;
		}
	}
}